

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

bool __thiscall
icu_63::RBBITableBuilder::findDuplCharClassFrom(RBBITableBuilder *this,IntPair *categories)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int32_t iVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  
  iVar1 = this->fDStates->count;
  iVar4 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  uVar7 = categories->first;
  do {
    if (iVar4 + -1 <= (int)uVar7) {
      return false;
    }
    uVar6 = (ulong)uVar7;
    uVar7 = uVar7 + 1;
    categories->second = uVar7;
    if ((int)uVar7 < iVar4) {
      do {
        if (0 < iVar1) {
          iVar10 = 1;
          do {
            pvVar5 = UVector::elementAt(this->fDStates,iVar10 + -1);
            lVar2 = *(long *)((long)pvVar5 + 0x28);
            uVar6 = (ulong)categories->first;
            sVar9 = 0;
            if ((-1 < (long)uVar6) && (categories->first < *(int *)(lVar2 + 8))) {
              sVar9 = (short)*(undefined4 *)(*(long *)(lVar2 + 0x18) + uVar6 * 4);
            }
            uVar7 = categories->second;
            sVar8 = 0;
            if ((-1 < (long)(int)uVar7) && (sVar8 = 0, (int)uVar7 < *(int *)(lVar2 + 8))) {
              sVar8 = (short)*(undefined4 *)(*(long *)(lVar2 + 0x18) + (long)(int)uVar7 * 4);
            }
          } while ((sVar8 == sVar9) && (bVar3 = iVar10 < iVar1, iVar10 = iVar10 + 1, bVar3));
          if (sVar8 == sVar9) {
            return true;
          }
        }
        uVar7 = uVar7 + 1;
        categories->second = uVar7;
      } while ((int)uVar7 < iVar4);
      uVar7 = (int)uVar6 + 1;
    }
    categories->first = uVar7;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplCharClassFrom(IntPair *categories) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; categories->first < numCols-1; categories->first++) {
        for (categories->second=categories->first+1; categories->second < numCols; categories->second++) {
            // Initialized to different values to prevent returning true if numStates = 0 (implies no duplicates).
            uint16_t table_base = 0;
            uint16_t table_dupl = 1;
            for (int32_t state=0; state<numStates; state++) {
                RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
                table_base = (uint16_t)sd->fDtran->elementAti(categories->first);
                table_dupl = (uint16_t)sd->fDtran->elementAti(categories->second);
                if (table_base != table_dupl) {
                    break;
                }
            }
            if (table_base == table_dupl) {
                return true;
            }
        }
    }
    return false;
}